

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_deflate_init(archive_read *a,zip *zip)

{
  int local_24;
  wchar_t r;
  zip *zip_local;
  archive_read *a_local;
  
  if (zip->decompress_init == '\0') {
    if (zip->stream_valid == '\0') {
      local_24 = inflateInit2_(&zip->stream,0xfffffff1,"1.2.11",0x70);
    }
    else {
      local_24 = inflateReset(&zip->stream);
    }
    if (local_24 != 0) {
      archive_set_error(&a->archive,-1,"Can\'t initialize ZIP decompression.");
      return L'\xffffffe2';
    }
    zip->stream_valid = '\x01';
    zip->decompress_init = '\x01';
  }
  return L'\0';
}

Assistant:

static int
zip_deflate_init(struct archive_read *a, struct zip *zip)
{
	int r;

	/* If we haven't yet read any data, initialize the decompressor. */
	if (!zip->decompress_init) {
		if (zip->stream_valid)
			r = inflateReset(&zip->stream);
		else
			r = inflateInit2(&zip->stream,
			    -15 /* Don't check for zlib header */);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize ZIP decompression.");
			return (ARCHIVE_FATAL);
		}
		/* Stream structure has been set up. */
		zip->stream_valid = 1;
		/* We've initialized decompression for this stream. */
		zip->decompress_init = 1;
	}
	return (ARCHIVE_OK);
}